

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalNinjaGenerator::OpenRulesFileStream(cmGlobalNinjaGenerator *this)

{
  char *pcVar1;
  cmGeneratedFileStream *this_00;
  ostream *poVar2;
  string rulesFilePath;
  allocator local_31;
  char *local_30 [4];
  
  pcVar1 = cmake::GetHomeOutputDirectory
                     ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance);
  std::__cxx11::string::string((string *)local_30,pcVar1,&local_31);
  std::__cxx11::string::append((char *)local_30);
  std::__cxx11::string::append((char *)local_30);
  this_00 = this->RulesFileStream;
  if (this_00 == (cmGeneratedFileStream *)0x0) {
    this_00 = (cmGeneratedFileStream *)operator_new(0x248);
    cmGeneratedFileStream::cmGeneratedFileStream(this_00,local_30[0],false);
    this->RulesFileStream = this_00;
  }
  WriteDisclaimer(this,(ostream *)this_00);
  poVar2 = std::operator<<((ostream *)this->RulesFileStream,
                           "# This file contains all the rules used to get the outputs files\n");
  poVar2 = std::operator<<(poVar2,"# built from the input files.\n");
  poVar2 = std::operator<<(poVar2,"# It is included in the main \'");
  poVar2 = std::operator<<(poVar2,NINJA_BUILD_FILE);
  std::operator<<(poVar2,"\'.\n\n");
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::OpenRulesFileStream()
{
  // Compute Ninja's build file path.
  std::string rulesFilePath =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  rulesFilePath += "/";
  rulesFilePath += cmGlobalNinjaGenerator::NINJA_RULES_FILE;

  // Get a stream where to generate things.
  if (!this->RulesFileStream)
    {
    this->RulesFileStream = new cmGeneratedFileStream(rulesFilePath.c_str());
    if (!this->RulesFileStream)
      {
      // An error message is generated by the constructor if it cannot
      // open the file.
      return;
      }
    }

  // Write the do not edit header.
  this->WriteDisclaimer(*this->RulesFileStream);

  // Write comment about this file.
  *this->RulesFileStream
    << "# This file contains all the rules used to get the outputs files\n"
    << "# built from the input files.\n"
    << "# It is included in the main '" << NINJA_BUILD_FILE << "'.\n\n"
    ;
}